

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLScanner::getURIText(XMLScanner *this,uint uriId,XMLBuffer *uriBufToFill)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,uriId);
    if ((XMLCh *)CONCAT44(extraout_var,iVar1) != (XMLCh *)0x0) {
      XMLBuffer::set(uriBufToFill,(XMLCh *)CONCAT44(extraout_var,iVar1));
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLScanner::getURIText(  const   unsigned int    uriId
                      ,       XMLBuffer&      uriBufToFill) const
{
    if (fURIStringPool->exists(uriId)) {
        // Look up the URI in the string pool and return its id
        const XMLCh* value = fURIStringPool->getValueForId(uriId);
        if (!value)
            return false;

        uriBufToFill.set(value);
        return true;
    }
    else
        return false;
}